

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t array_container_read(int32_t cardinality,array_container_t *container,char *buf)

{
  int32_t iVar1;
  char *buf_local;
  array_container_t *container_local;
  int32_t cardinality_local;
  
  if (container->capacity < cardinality) {
    array_container_grow(container,cardinality,false);
  }
  container->cardinality = cardinality;
  memcpy(container->array,buf,(long)container->cardinality << 1);
  iVar1 = array_container_size_in_bytes(container);
  return iVar1;
}

Assistant:

int32_t array_container_read(int32_t cardinality, array_container_t *container,
                             const char *buf) {
    if (container->capacity < cardinality) {
        array_container_grow(container, cardinality, false);
    }
    container->cardinality = cardinality;
    memcpy(container->array, buf, container->cardinality * sizeof(uint16_t));

    return array_container_size_in_bytes(container);
}